

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateSetStateChangeCallback
               (HelicsFederate fed,
               _func_void_HelicsFederateState_HelicsFederateState_void_ptr *stateChange,
               void *userdata,HelicsError *err)

{
  Federate *pFVar1;
  Federate *in_RDX;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_RSI;
  Federate *fedptr;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_stack_ffffffffffffff60;
  HelicsError *in_stack_ffffffffffffff68;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_stack_ffffffffffffff70;
  function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *in_stack_ffffffffffffff78;
  Federate *in_stack_ffffffffffffff80;
  
  pFVar1 = getFed(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (pFVar1 != (Federate *)0x0) {
    if (in_RSI == (function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x0) {
      std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::function
                (in_stack_ffffffffffffff60);
      helics::Federate::setModeUpdateCallback(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::~function
                ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x1bce76);
    }
    else {
      std::function<void(helics::Federate::Modes,helics::Federate::Modes)>::
      function<helicsFederateSetStateChangeCallback::__0,void>
                (in_stack_ffffffffffffff70,(anon_class_16_2_d1482e6b *)in_stack_ffffffffffffff68);
      helics::Federate::setModeUpdateCallback(in_RDX,in_RSI);
      std::function<void_(helics::Federate::Modes,_helics::Federate::Modes)>::~function
                ((function<void_(helics::Federate::Modes,_helics::Federate::Modes)> *)0x1bcee9);
    }
  }
  return;
}

Assistant:

void helicsFederateSetStateChangeCallback(HelicsFederate fed,
                                          void (*stateChange)(HelicsFederateState newState, HelicsFederateState oldState, void* userdata),
                                          void* userdata,
                                          HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (stateChange == nullptr) {
            fedptr->setModeUpdateCallback({});
        } else {
            fedptr->setModeUpdateCallback([stateChange, userdata](helics::Federate::Modes newMode, helics::Federate::Modes oldMode) {
                stateChange(stateConversion(newMode), stateConversion(oldMode), userdata);
            });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}